

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.hxx
# Opt level: O2

void __thiscall
andres::View<MyTestType,false,std::allocator<unsigned_long>>::view<unsigned_long*,unsigned_long*>
          (View<MyTestType,false,std::allocator<unsigned_long>> *this,unsigned_long *bit,
          unsigned_long *sit,CoordinateOrder *internalCoordinateOrder,
          View<MyTestType,_false,_std::allocator<unsigned_long>_> *out)

{
  size_t sVar1;
  size_t offset;
  allocator_type local_39;
  size_t local_38;
  
  View<MyTestType,_false,_std::allocator<unsigned_long>_>::testInvariant
            ((View<MyTestType,_false,_std::allocator<unsigned_long>_> *)this);
  local_38 = 0;
  coordinatesToOffset<unsigned_long*>(this,bit,&local_38);
  sVar1 = View<MyTestType,_false,_std::allocator<unsigned_long>_>::dimension
                    ((View<MyTestType,_false,_std::allocator<unsigned_long>_> *)this);
  assign<unsigned_long*,unsigned_long_const*>
            ((View<MyTestType,false,std::allocator<unsigned_long>> *)out,sit,sit + sVar1,
             *(unsigned_long **)(this + 0x20),(pointer)(*(long *)this + local_38),
             internalCoordinateOrder,&local_39);
  return;
}

Assistant:

inline void
View<T, isConst, A>::view
(
    BaseIterator bit,
    ShapeIterator sit,
    const CoordinateOrder& internalCoordinateOrder,
    View<T, isConst, A>& out
) const
{
    testInvariant();
    std::size_t offset = 0;
    coordinatesToOffset(bit, offset);
    out.assign(sit, sit+dimension(), geometry_.stridesBegin(),
        data_+offset, internalCoordinateOrder);
}